

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O2

bool __thiscall cmQtAutoGenerator::InfoT::GetBool(InfoT *this,string *key,bool *value,bool required)

{
  bool bVar1;
  bool bVar2;
  Value *this_00;
  string_view message;
  string local_48;
  
  this_00 = Json::Value::operator[](&this->Json_,key);
  bVar1 = Json::Value::isBool(this_00);
  if (bVar1) {
    bVar1 = Json::Value::asBool(this_00);
    *value = bVar1;
    bVar2 = true;
  }
  else {
    bVar1 = Json::Value::isNull(this_00);
    bVar2 = true;
    if (!bVar1 || required) {
      cmStrCat<std::__cxx11::string_const&,char_const(&)[19]>
                (&local_48,key,(char (*) [19])" is not a boolean.");
      message._M_str = local_48._M_dataplus._M_p;
      message._M_len = local_48._M_string_length;
      LogError(this,message);
      std::__cxx11::string::~string((string *)&local_48);
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool cmQtAutoGenerator::InfoT::GetBool(std::string const& key, bool& value,
                                       bool required) const
{
  Json::Value const& jval = this->Json_[key];
  if (jval.isBool()) {
    value = jval.asBool();
  } else {
    if (!jval.isNull() || required) {
      return this->LogError(cmStrCat(key, " is not a boolean."));
    }
  }
  return true;
}